

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

curl_socket_t connect_to(char *ipaddr,unsigned_short port)

{
  uint uVar1;
  undefined2 uVar2;
  _Bool _Var3;
  int iVar4;
  uint *puVar5;
  char *pcVar6;
  undefined4 local_ac;
  char *pcStack_a8;
  curl_socklen_t flag;
  char *cl_br;
  char *op_br;
  int rc;
  int error;
  curl_socket_t serverfd;
  srvr_sockaddr_union_t serveraddr;
  unsigned_short port_local;
  char *ipaddr_local;
  
  op_br._0_4_ = 0;
  cl_br = "";
  pcStack_a8 = "";
  if (socket_domain == socket_domain_inet6) {
    cl_br = "[";
    pcStack_a8 = "]";
  }
  if (ipaddr == (char *)0x0) {
    ipaddr_local._4_4_ = -1;
  }
  else {
    serveraddr._106_2_ = port;
    unique0x100002cf = ipaddr;
    logmsg("about to connect to %s%s%s:%hu",cl_br,ipaddr,pcStack_a8,(ulong)port);
    rc = socket(socket_domain,1,0);
    if (rc == -1) {
      puVar5 = (uint *)__errno_location();
      uVar1 = *puVar5;
      op_br._4_4_ = uVar1;
      pcVar6 = strerror(uVar1);
      logmsg("Error creating socket for server connection: (%d) %s",(ulong)uVar1,pcVar6);
      ipaddr_local._4_4_ = -1;
    }
    else {
      _Var3 = socket_domain_is_ip();
      if (_Var3) {
        local_ac = 1;
        iVar4 = setsockopt(rc,6,1,&local_ac,4);
        if (iVar4 != 0) {
          logmsg("====> TCP_NODELAY for server connection failed");
        }
      }
      if (socket_domain == FLAGS_SPACE) {
        logmsg("Proxying through Unix socket is not (yet?) supported.");
        ipaddr_local._4_4_ = -1;
      }
      else {
        if (socket_domain == FLAGS_SHOWSIGN) {
          memset(&error,0,0x10);
          error._0_2_ = 2;
          error._2_2_ = htons(serveraddr._106_2_);
          iVar4 = inet_pton(2,stack0xffffffffffffffe8,&serverfd);
          if (iVar4 < 1) {
            logmsg("Error inet_pton failed AF_INET conversion of \'%s\'",stack0xffffffffffffffe8);
            close(rc);
            return -1;
          }
          op_br._0_4_ = connect(rc,(sockaddr *)&error,0x10);
        }
        else if (socket_domain == socket_domain_inet6) {
          memset(&error,0,0x1c);
          error._0_2_ = 10;
          error._2_2_ = htons(serveraddr._106_2_);
          iVar4 = inet_pton(10,stack0xffffffffffffffe8,&serveraddr);
          if (iVar4 < 1) {
            logmsg("Error inet_pton failed AF_INET6 conversion of \'%s\'",stack0xffffffffffffffe8);
            close(rc);
            return -1;
          }
          op_br._0_4_ = connect(rc,(sockaddr *)&error,0x1c);
        }
        if (got_exit_signal == 0) {
          if ((int)op_br == 0) {
            logmsg("connected fine to %s%s%s:%hu, now tunnel",cl_br,stack0xffffffffffffffe8,
                   pcStack_a8,(ulong)(ushort)serveraddr._106_2_);
            ipaddr_local._4_4_ = rc;
          }
          else {
            puVar5 = (uint *)__errno_location();
            uVar2 = serveraddr._106_2_;
            uVar1 = *puVar5;
            op_br._4_4_ = uVar1;
            pcVar6 = strerror(uVar1);
            logmsg("Error connecting to server port %hu: (%d) %s",(ulong)(ushort)uVar2,(ulong)uVar1,
                   pcVar6);
            close(rc);
            ipaddr_local._4_4_ = -1;
          }
        }
        else {
          close(rc);
          ipaddr_local._4_4_ = -1;
        }
      }
    }
  }
  return ipaddr_local._4_4_;
}

Assistant:

static curl_socket_t connect_to(const char *ipaddr, unsigned short port)
{
  srvr_sockaddr_union_t serveraddr;
  curl_socket_t serverfd;
  int error;
  int rc = 0;
  const char *op_br = "";
  const char *cl_br = "";

#ifdef ENABLE_IPV6
  if(socket_domain == AF_INET6) {
    op_br = "[";
    cl_br = "]";
  }
#endif

  if(!ipaddr)
    return CURL_SOCKET_BAD;

  logmsg("about to connect to %s%s%s:%hu",
         op_br, ipaddr, cl_br, port);


  serverfd = socket(socket_domain, SOCK_STREAM, 0);
  if(CURL_SOCKET_BAD == serverfd) {
    error = SOCKERRNO;
    logmsg("Error creating socket for server connection: (%d) %s",
           error, strerror(error));
    return CURL_SOCKET_BAD;
  }

#ifdef TCP_NODELAY
  if(socket_domain_is_ip()) {
    /* Disable the Nagle algorithm */
    curl_socklen_t flag = 1;
    if(0 != setsockopt(serverfd, IPPROTO_TCP, TCP_NODELAY,
                       (void *)&flag, sizeof(flag)))
      logmsg("====> TCP_NODELAY for server connection failed");
  }
#endif

  switch(socket_domain) {
  case AF_INET:
    memset(&serveraddr.sa4, 0, sizeof(serveraddr.sa4));
    serveraddr.sa4.sin_family = AF_INET;
    serveraddr.sa4.sin_port = htons(port);
    if(Curl_inet_pton(AF_INET, ipaddr, &serveraddr.sa4.sin_addr) < 1) {
      logmsg("Error inet_pton failed AF_INET conversion of '%s'", ipaddr);
      sclose(serverfd);
      return CURL_SOCKET_BAD;
    }

    rc = connect(serverfd, &serveraddr.sa, sizeof(serveraddr.sa4));
    break;
#ifdef ENABLE_IPV6
  case AF_INET6:
    memset(&serveraddr.sa6, 0, sizeof(serveraddr.sa6));
    serveraddr.sa6.sin6_family = AF_INET6;
    serveraddr.sa6.sin6_port = htons(port);
    if(Curl_inet_pton(AF_INET6, ipaddr, &serveraddr.sa6.sin6_addr) < 1) {
      logmsg("Error inet_pton failed AF_INET6 conversion of '%s'", ipaddr);
      sclose(serverfd);
      return CURL_SOCKET_BAD;
    }

    rc = connect(serverfd, &serveraddr.sa, sizeof(serveraddr.sa6));
    break;
#endif /* ENABLE_IPV6 */
#ifdef USE_UNIX_SOCKETS
  case AF_UNIX:
    logmsg("Proxying through Unix socket is not (yet?) supported.");
    return CURL_SOCKET_BAD;
#endif /* USE_UNIX_SOCKETS */
  }

  if(got_exit_signal) {
    sclose(serverfd);
    return CURL_SOCKET_BAD;
  }

  if(rc) {
    error = SOCKERRNO;
    logmsg("Error connecting to server port %hu: (%d) %s",
           port, error, strerror(error));
    sclose(serverfd);
    return CURL_SOCKET_BAD;
  }

  logmsg("connected fine to %s%s%s:%hu, now tunnel",
         op_br, ipaddr, cl_br, port);

  return serverfd;
}